

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  int line;
  bool bVar1;
  char *test_name;
  char *file;
  char *local_460;
  anon_class_72_2_4f66548f_for_factory_ local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [8];
  string full_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [8];
  string message;
  char kMissingTestCase [348];
  char kMissingInstantiation [378];
  _Self local_30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ignored;
  CodeLocation *pCStack_18;
  bool has_test_p_local;
  CodeLocation *location_local;
  string *name_local;
  
  ignored._7_1_ = has_test_p;
  pCStack_18 = location;
  location_local = (CodeLocation *)name;
  local_28 = GetIgnoredParameterizedTestSuites_abi_cxx11_();
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(local_28,&location_local->file);
  register0x00000000 =
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(local_28);
  bVar1 = std::operator!=(&local_30,(_Self *)(kMissingInstantiation + 0x178));
  if (!bVar1) {
    memcpy(kMissingTestCase + 0x158,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy((void *)((long)&message.field_2 + 8),
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+(&local_3b8,"Parameterized test suite ",&location_local->file);
    if ((ignored._7_1_ & 1) == 0) {
      local_460 = message.field_2._M_local_buf + 8;
    }
    else {
      local_460 = kMissingTestCase + 0x158;
    }
    std::operator+(&local_398,&local_3b8,local_460);
    std::operator+(&local_378,&local_398,
                   "\n\nTo suppress this error for this test suite, insert the following line (in a non-header) in the namespace it is defined in:\n\nGTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST("
                  );
    std::operator+(&local_358,&local_378,&location_local->file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                   &local_358,");");
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::operator+(&local_408,"UninstantiatedParameterizedTestSuite<",&location_local->file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8,
                   &local_408,">");
    std::__cxx11::string::~string((string *)&local_408);
    test_name = (char *)std::__cxx11::string::c_str();
    file = (char *)std::__cxx11::string::c_str();
    line = location->line;
    std::__cxx11::string::string((string *)&local_450,(string *)local_338);
    CodeLocation::CodeLocation(&local_450.location,location);
    RegisterTest<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_LLNL[P]camp_extern_blt_thirdparty_builtin_googletest_googletest_src_gtest_cc:544:45)>
              ("GoogleTestVerification",test_name,(char *)0x0,(char *)0x0,file,line,&local_450);
    InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation,bool)::$_0::
    ~__0((__0 *)&local_450);
    std::__cxx11::string::~string((string *)local_3e8);
    std::__cxx11::string::~string((string *)local_338);
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
      name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}